

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faces_kba.c
# Opt level: O0

void Faces_send_faces_end
               (Faces *faces,StepScheduler *stepscheduler,Dimensions dims_b,int step,Env *env)

{
  int iVar1;
  Bool_t BVar2;
  Request_t *local_58;
  Request_t *request;
  int local_40;
  Bool_t do_send;
  int dir_ind;
  Bool_t axis_x;
  int axis;
  int octant_in_block;
  int proc_y;
  int proc_x;
  Env *env_local;
  int step_local;
  StepScheduler *stepscheduler_local;
  Faces *faces_local;
  
  iVar1 = Faces_is_face_comm_async(faces);
  if (iVar1 != 0) {
    Env_proc_x_this(env);
    Env_proc_y_this(env);
    for (axis_x = 0; axis_x < faces->noctant_per_block; axis_x = axis_x + 1) {
      for (dir_ind = 0; dir_ind < 2; dir_ind = dir_ind + 1) {
        for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
          BVar2 = StepScheduler_must_do_send(stepscheduler,step,dir_ind,local_40,axis_x,env);
          if (BVar2 != 0) {
            if (dir_ind == 0) {
              local_58 = faces->request_send_xz + axis_x;
            }
            else {
              local_58 = faces->request_send_yz + axis_x;
            }
            Env_wait(env,local_58);
          }
        }
      }
    }
    return;
  }
  __assert_fail("Faces_is_face_comm_async( faces )",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/faces_kba.c"
                ,0x134,"void Faces_send_faces_end(Faces *, StepScheduler *, Dimensions, int, Env *)"
               );
}

Assistant:

void Faces_send_faces_end(
  Faces*          faces,
  StepScheduler*  stepscheduler,
  Dimensions      dims_b,
  int             step,
  Env*            env )
{
  Assert( Faces_is_face_comm_async( faces ) );

  const int proc_x = Env_proc_x_this( env );
  const int proc_y = Env_proc_y_this( env );

  /*---Loop over octants---*/

  int octant_in_block = 0;

  for( octant_in_block=0; octant_in_block<faces->noctant_per_block;
                                                            ++octant_in_block )
  {
    /*---Communicate +/-X, +/-Y---*/

    int axis = 0;

    for( axis=0; axis<2; ++axis )
    {
      const Bool_t axis_x = axis==0;

      int dir_ind = 0;

      for( dir_ind=0; dir_ind<2; ++dir_ind )
      {

        /*---Determine whether to communicate---*/

        Bool_t const do_send = StepScheduler_must_do_send(
                   stepscheduler, step, axis, dir_ind, octant_in_block, env );

        if( do_send )
        {
          Request_t* request = axis_x ?
                                   & faces->request_send_xz[octant_in_block]
                                 : & faces->request_send_yz[octant_in_block];
          Env_wait( env, request );
        }
      } /*---dir_ind---*/
    } /*---axis---*/
  } /*---octant_in_block---*/
}